

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void new_localvar(LexState *ls,TString *name)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  FuncState *fs_00;
  Dyndata *pDVar4;
  Proto *o;
  LocVar *pLVar5;
  long lVar6;
  Vardesc *pVVar7;
  FuncState *fs;
  
  fs_00 = ls->fs;
  pDVar4 = ls->dyd;
  o = fs_00->f;
  iVar2 = o->sizelocvars;
  if (iVar2 <= fs_00->nlocvars) {
    pLVar5 = (LocVar *)luaM_growaux_(ls->L,o->locvars,&o->sizelocvars,0x10,0x7fff,"local variables")
    ;
    o->locvars = pLVar5;
  }
  iVar3 = o->sizelocvars;
  if (iVar2 < iVar3) {
    lVar6 = (long)iVar3 - (long)iVar2;
    pLVar5 = o->locvars + iVar2;
    do {
      pLVar5->varname = (TString *)0x0;
      pLVar5 = pLVar5 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  o->locvars[fs_00->nlocvars].varname = name;
  if (((o->marked & 4) != 0) && ((name->marked & 3) != 0)) {
    luaC_barrier_(ls->L,(GCObject *)o,(GCObject *)name);
  }
  uVar1 = fs_00->nlocvars;
  fs_00->nlocvars = uVar1 + 1;
  iVar2 = (pDVar4->actvar).n;
  if ((iVar2 - fs_00->firstlocal) + 1 < 0xc9) {
    if ((pDVar4->actvar).size < iVar2 + 2) {
      pVVar7 = (Vardesc *)
               luaM_growaux_(ls->L,(pDVar4->actvar).arr,&(pDVar4->actvar).size,2,0x7fffffff,
                             "local variables");
      (pDVar4->actvar).arr = pVVar7;
    }
    iVar2 = (pDVar4->actvar).n;
    (pDVar4->actvar).n = iVar2 + 1;
    (pDVar4->actvar).arr[iVar2].idx = uVar1;
    return;
  }
  errorlimit(fs_00,200,"local variables");
}

Assistant:

static int new_localvar (LexState *ls, TString *name) {
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  Dyndata *dyd = ls->dyd;
  Vardesc *var;
  checklimit(fs, dyd->actvar.n + 1 - fs->firstlocal,
                 MAXVARS, "local variables");
  luaM_growvector(L, dyd->actvar.arr, dyd->actvar.n + 1,
                  dyd->actvar.size, Vardesc, USHRT_MAX, "local variables");
  var = &dyd->actvar.arr[dyd->actvar.n++];
  var->vd.kind = VDKREG;  /* default */
  var->vd.name = name;
  return dyd->actvar.n - 1 - fs->firstlocal;
}